

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void check_trap(wasm_func_t *func,int i,wasm_val_t *args)

{
  long lVar1;
  wasm_trap_t *trap;
  wasm_val_vec_t results;
  wasm_val_vec_t args_;
  wasm_val_t r;
  wasm_val_t *args_local;
  int i_local;
  wasm_func_t *func_local;
  
  args_.data = (wasm_val_t *)0x80;
  results.data = (wasm_val_t *)(long)i;
  trap = (wasm_trap_t *)0x1;
  results.size = (size_t)&args_.data;
  args_.size = (size_t)args;
  lVar1 = wasm_func_call(func,&results.data,&trap);
  if (lVar1 == 0) {
    printf("> Error on result, expected trap\n");
    exit(1);
  }
  wasm_trap_delete(lVar1);
  return;
}

Assistant:

void check_trap(wasm_func_t* func, int i, wasm_val_t args[]) {
  wasm_val_t r = WASM_INIT_VAL;
  wasm_val_vec_t args_ = {i, args};
  wasm_val_vec_t results = {1, &r};
  own wasm_trap_t* trap = wasm_func_call(func, &args_, &results);
  if (! trap) {
    printf("> Error on result, expected trap\n");
    exit(1);
  }
  wasm_trap_delete(trap);
}